

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_errors.hpp
# Opt level: O0

void Fossilize::log_missing_resource(char *type,Hash hash)

{
  bool bVar1;
  LogLevel LVar2;
  Hash hash_local;
  char *type_local;
  
  LVar2 = get_thread_log_level();
  if (((int)LVar2 < 2) &&
     (bVar1 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                         ,type,hash), !bVar1)) {
    fprintf(_stderr,
            "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
            ,type,hash);
  }
  return;
}

Assistant:

static inline void log_missing_resource(const char *type, Hash hash)
{
	LOGW_LEVEL("Referenced %s %016" PRIx64
			           ", but it does not exist.\n"
			           "This can be expected when replaying an archive from Steam.\n"
			           "If replaying just the application cache, "
			           "make sure to replay together with the common cache, "
			           "as application cache can depend on common cache.\n",
	           type, hash);
}